

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::PresetVectorIntHelper
          (vector<int,_std::allocator<int>_> *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  _func_ReadFileResult_int_ptr_Value_ptr *in_R8;
  Value *value_local;
  vector<int,_std::allocator<int>_> *out_local;
  
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)::helper ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                                 ::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<int,cmCMakePresetsGraph::ReadFileResult(*)(int&,Json::Value_const*)>
                (&PresetVectorIntHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESET,
                 0x56d1e0,in_R8);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*)>
                   ::~function,&PresetVectorIntHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*)>
          ::operator()(&PresetVectorIntHelper::helper,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetVectorIntHelper(
  std::vector<int>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, PresetIntHelper);

  return helper(out, value);
}